

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O1

string * ApprovalTests::StringUtils::rightTrim(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  pointer pcVar5;
  pointer pcVar6;
  long lVar7;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  pcVar6 = pcVar2 + s->_M_string_length;
  lVar7 = (long)s->_M_string_length >> 2;
  pcVar5 = pcVar6;
  if (0 < lVar7) {
    pcVar5 = pcVar6 + lVar7 * -4;
    lVar7 = lVar7 + 1;
    do {
      iVar4 = isspace((uint)(byte)pcVar6[-1]);
      if (iVar4 == 0) goto LAB_00191476;
      iVar4 = isspace((uint)(byte)pcVar6[-2]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -1;
        goto LAB_00191476;
      }
      iVar4 = isspace((uint)(byte)pcVar6[-3]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -2;
        goto LAB_00191476;
      }
      iVar4 = isspace((uint)(byte)pcVar6[-4]);
      if (iVar4 == 0) {
        pcVar6 = pcVar6 + -3;
        goto LAB_00191476;
      }
      pcVar6 = pcVar6 + -4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar5 - (long)pcVar2;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar6 = pcVar2;
      if ((lVar7 != 3) || (iVar4 = isspace((uint)(byte)pcVar5[-1]), pcVar6 = pcVar5, iVar4 == 0))
      goto LAB_00191476;
      pcVar5 = pcVar5 + -1;
    }
    iVar4 = isspace((uint)(byte)pcVar5[-1]);
    pcVar6 = pcVar5;
    if (iVar4 == 0) goto LAB_00191476;
    pcVar5 = pcVar5 + -1;
  }
  iVar4 = isspace((uint)(byte)pcVar5[-1]);
  pcVar6 = pcVar5;
  if (iVar4 != 0) {
    pcVar6 = pcVar2;
  }
LAB_00191476:
  s->_M_string_length = (long)pcVar6 - (long)pcVar2;
  *pcVar6 = '\0';
  pcVar6 = (s->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::rightTrim(std::string s)
    {
        s.erase(std::find_if(s.rbegin(),
                             s.rend(),
                             [](unsigned char ch) { return !std::isspace(ch); })
                    .base(),
                s.end());
        return s;
    }